

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICallReader.cpp
# Opt level: O0

void __thiscall ICallReader::getWord(ICallReader *this,string *str)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  char local_19;
  string *psStack_18;
  char tempChar;
  string *str_local;
  ICallReader *this_local;
  
  psStack_18 = str;
  str_local = (string *)this;
  while ((local_19 = std::istream::get(), local_19 != -1 &&
         (bVar1 = IDictionary::isLetterOrNumberOrDL(local_19), bVar1))) {
    std::__cxx11::string::operator+=((string *)psStack_18,local_19);
  }
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&IDictionary::fun_abi_cxx11_,psStack_18);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&IDictionary::fun_abi_cxx11_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)psStack_18,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->m_funName,(string *)psStack_18);
    do {
      bVar1 = IDictionary::isBlankSep(local_19);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)psStack_18,local_19);
      if (local_19 == '\n') {
        std::__cxx11::string::operator+=((string *)psStack_18,'\n');
      }
      local_19 = std::istream::get();
    } while (local_19 != -1);
    if (local_19 == '(') {
      std::__cxx11::string::operator+=((string *)psStack_18,'(');
      do {
        local_19 = std::istream::get();
        if (local_19 == -1) {
          return;
        }
        std::__cxx11::string::operator+=((string *)psStack_18,local_19);
      } while (local_19 != ')');
    }
    else {
      std::__cxx11::string::operator=((string *)psStack_18,"");
    }
  }
  return;
}

Assistant:

void ICallReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar=m_ifs->get())!=EOF)
    {
        if(!IDictionary::isLetterOrNumberOrDL(tempChar))
            break;
        str+=tempChar;
    }
    if(IDictionary::fun.find(str)==IDictionary::fun.end())
    {
        str="";
        return;
    }
    else
        m_funName=str;
    do
    {
        if(IDictionary::isBlankSep(tempChar))
        {
            str+=tempChar;
            if(tempChar=='\n')
                str+='\n';
        }
        else
            break;
    }while((tempChar=m_ifs->get())!=EOF);

    if(tempChar=='(')
        str+=tempChar;
    else
    {
        str="";
        return;
    }

    while((tempChar=m_ifs->get())!=EOF)
    {
        str+=tempChar;
        if(tempChar==')')
            break;
    }
}